

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * pugi::impl::anon_unknown_0::strconv_escape(char_t *s,gap *g)

{
  byte *pbVar1;
  char_t cVar2;
  byte bVar3;
  uint uVar4;
  char_t *pcVar5;
  uint ch;
  size_t sStack_20;
  value_type local_18;
  
  cVar2 = s[1];
  local_18 = s + 1;
  if (cVar2 == 'q') {
    if (s[2] != 'u') goto LAB_00125b65;
    if (s[3] != 'o') goto LAB_00125b8f;
    if (s[4] != 't') goto LAB_00125bb7;
    if (s[5] != ';') {
LAB_00125bf0:
      return s + 5;
    }
    *s = '\"';
  }
  else {
    if (cVar2 != 'a') {
      if (cVar2 == 'g') {
        if (s[2] != 't') {
LAB_00125b65:
          return s + 2;
        }
        if (s[3] != ';') goto LAB_00125b8f;
        *s = '>';
      }
      else {
        if (cVar2 != 'l') {
          if (cVar2 != '#') {
            return local_18;
          }
          bVar3 = s[2];
          pcVar5 = s + 2;
          if (bVar3 == 0x3b) {
            return pcVar5;
          }
          if (bVar3 == 0x78) {
            bVar3 = s[3];
            pcVar5 = s + 3;
            if (bVar3 == 0x3b) {
              return pcVar5;
            }
            ch = 0;
            do {
              if (bVar3 - 0x30 < 10) {
                ch = ch << 4 | bVar3 - 0x30;
              }
              else {
                uVar4 = bVar3 | 0x20;
                if (5 < uVar4 - 0x61) goto LAB_00125bbd;
                ch = ch * 0x10 + -0x57 + uVar4;
              }
              bVar3 = pcVar5[1];
              pcVar5 = pcVar5 + 1;
            } while( true );
          }
          ch = 0;
          while (bVar3 - 0x30 < 10) {
            ch = (bVar3 - 0x30) + ch * 10;
            pbVar1 = pcVar5 + 1;
            pcVar5 = pcVar5 + 1;
            bVar3 = *pbVar1;
          }
          if (bVar3 != 0x3b) {
            return pcVar5;
          }
          goto LAB_00125bc2;
        }
        if (s[2] != 't') goto LAB_00125b65;
        if (s[3] != ';') goto LAB_00125b8f;
        *s = '<';
      }
      pcVar5 = s + 4;
      sStack_20 = 3;
      goto LAB_00125be3;
    }
    if (s[2] != 'p') {
      if (s[2] != 'm') goto LAB_00125b65;
      if (s[3] != 'p') goto LAB_00125b8f;
      if (s[4] != ';') goto LAB_00125bb7;
      *s = '&';
      pcVar5 = s + 5;
      sStack_20 = 4;
      goto LAB_00125be3;
    }
    if (s[3] != 'o') {
LAB_00125b8f:
      return s + 3;
    }
    if (s[4] != 's') {
LAB_00125bb7:
      return s + 4;
    }
    if (s[5] != ';') goto LAB_00125bf0;
    *s = '\'';
  }
  pcVar5 = s + 6;
  sStack_20 = 5;
  goto LAB_00125be3;
LAB_00125bbd:
  if (bVar3 != 0x3b) {
    return pcVar5;
  }
LAB_00125bc2:
  pcVar5 = pcVar5 + 1;
  if (ch < 0x10000) {
    local_18 = utf8_writer::low(s,ch);
  }
  else {
    local_18 = utf8_writer::high(s,ch);
  }
  sStack_20 = (long)pcVar5 - (long)local_18;
LAB_00125be3:
  gap::push(g,&local_18,sStack_20);
  return pcVar5;
}

Assistant:

PUGI__FN char_t* strconv_escape(char_t* s, gap& g)
	{
		char_t* stre = s + 1;

		switch (*stre)
		{
			case '#':	// &#...
			{
				unsigned int ucsc = 0;

				if (stre[1] == 'x') // &#x... (hex code)
				{
					stre += 2;

					char_t ch = *stre;

					if (ch == ';') return stre;

					for (;;)
					{
						if (static_cast<unsigned int>(ch - '0') <= 9)
							ucsc = 16 * ucsc + (ch - '0');
						else if (static_cast<unsigned int>((ch | ' ') - 'a') <= 5)
							ucsc = 16 * ucsc + ((ch | ' ') - 'a' + 10);
						else if (ch == ';')
							break;
						else // cancel
							return stre;

						ch = *++stre;
					}

					++stre;
				}
				else	// &#... (dec code)
				{
					char_t ch = *++stre;

					if (ch == ';') return stre;

					for (;;)
					{
						if (static_cast<unsigned int>(ch - '0') <= 9)
							ucsc = 10 * ucsc + (ch - '0');
						else if (ch == ';')
							break;
						else // cancel
							return stre;

						ch = *++stre;
					}

					++stre;
				}

			#ifdef PUGIXML_WCHAR_MODE
				s = reinterpret_cast<char_t*>(wchar_writer::any(reinterpret_cast<wchar_writer::value_type>(s), ucsc));
			#else
				s = reinterpret_cast<char_t*>(utf8_writer::any(reinterpret_cast<uint8_t*>(s), ucsc));
			#endif

				g.push(s, stre - s);
				return stre;
			}

			case 'a':	// &a
			{
				++stre;

				if (*stre == 'm') // &am
				{
					if (*++stre == 'p' && *++stre == ';') // &amp;
					{
						*s++ = '&';
						++stre;

						g.push(s, stre - s);
						return stre;
					}
				}
				else if (*stre == 'p') // &ap
				{
					if (*++stre == 'o' && *++stre == 's' && *++stre == ';') // &apos;
					{
						*s++ = '\'';
						++stre;

						g.push(s, stre - s);
						return stre;
					}
				}
				break;
			}

			case 'g': // &g
			{
				if (*++stre == 't' && *++stre == ';') // &gt;
				{
					*s++ = '>';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			case 'l': // &l
			{
				if (*++stre == 't' && *++stre == ';') // &lt;
				{
					*s++ = '<';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			case 'q': // &q
			{
				if (*++stre == 'u' && *++stre == 'o' && *++stre == 't' && *++stre == ';') // &quot;
				{
					*s++ = '"';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			default:
				break;
		}

		return stre;
	}